

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O2

int __thiscall Intel_V4L2::init_device(Intel_V4L2 *this)

{
  int iVar1;
  v4l2_plane *pvVar2;
  v4l2_buffer *pvVar3;
  char *pcVar4;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined8 local_218;
  undefined4 local_210;
  undefined1 local_20c [180];
  v4l2_capability cap;
  
  iVar1 = open("/dev/video1",2);
  this->m_fd = iVar1;
  if (iVar1 < 0) {
    pcVar4 = "Intel_V4L2::init_device : failed to open /dev/video1";
  }
  else {
    iVar1 = ioctl(iVar1,0x80685600,&cap);
    if (iVar1 < 0) {
      pcVar4 = "Intel_V4L2::init_device : VIDIOC_QUERYCAP : ";
    }
    else {
      iVar1 = ioctl(this->m_fd,0xc0d05605);
      if (iVar1 < 0) {
        pcVar4 = "Intel_V4L2::init_device : VIDIOC_S_FMT : ";
      }
      else {
        iVar1 = ioctl(this->m_fd,0xc0145608);
        if (iVar1 < 0) {
          pcVar4 = "Intel_V4L2::init_device : VIDIOC_REQBUFS : ";
        }
        else {
          memset(local_20c,0,0xb0);
          local_228 = 1;
          uStack_224 = 0x1000;
          uStack_220 = 0;
          uStack_21c = 1;
          local_218 = 6;
          local_210 = 0;
          iVar1 = ioctl(this->m_fd,0xc0cc5616,&local_228);
          if (-1 < iVar1) {
            iVar1 = ioctl(this->m_fd,0xc0585609);
            if (iVar1 < 0) {
              pcVar4 = "Intel_V4L2::init_device : VIDIOC_QUERYBUF : ";
            }
            else {
              this->m_bigBufferLength = 0x708400;
              pvVar2 = (v4l2_plane *)calloc(1,0x708400);
              this->m_pBigBuffer = (uchar *)pvVar2;
              if (pvVar2 == (v4l2_plane *)0x0) {
                __assert_fail("NULL != m_pBigBuffer",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/temburuyk[P]visual_odom/src/rgbd_standalone.cpp"
                              ,0x7c,"int Intel_V4L2::init_device()");
              }
              pvVar3 = (v4l2_buffer *)calloc(1,0x58);
              this->m_pV4l2Buffer = pvVar3;
              pvVar3->type = 1;
              pvVar3->memory = 2;
              (pvVar3->m).planes = pvVar2;
              pvVar3->length = 0x708400;
              this->m_bufType = 1;
              iVar1 = ioctl(this->m_fd,0x40045612,&this->m_bufType);
              if (-1 < iVar1) {
                return 0;
              }
              pcVar4 = "Intel_V4L2::init_device : VIDIOC_STREAMON";
            }
            perror(pcVar4);
            return 1;
          }
          pcVar4 = "Intel_V4L2::init_device : VIDIOC_S_PARM : ";
        }
      }
    }
  }
  perror(pcVar4);
  return 1;
}

Assistant:

int Intel_V4L2::init_device () {

    // Intel RGBD ir frames @/dev/video1 (Interlaced left and right)
    m_fd = open ("/dev/video1", O_RDWR);
    if (0 > m_fd) {
        perror ("Intel_V4L2::init_device : failed to open /dev/video1");
        return 1;
    }

    struct v4l2_capability cap;
    if (0 > ioctl (m_fd, VIDIOC_QUERYCAP, &cap)) {
        perror ("Intel_V4L2::init_device : VIDIOC_QUERYCAP : ");
        return 1;
    }

    // Image format parameters :
    struct v4l2_format fmt;
    fmt.type                = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    fmt.fmt.pix.width       = 640;
    fmt.fmt.pix.height      = 480;
    fmt.fmt.pix.pixelformat = v4l2_fourcc('Y', '8', 'I', ' ');
    fmt.fmt.pix.field       = V4L2_FIELD_NONE;
    if (0 > ioctl (m_fd, VIDIOC_S_FMT, &fmt)) {
        perror ("Intel_V4L2::init_device : VIDIOC_S_FMT : ");
        return 1;
    }

    // Setup buffers. For RGBD, need to use memory buffer obtained from malloc.
    struct v4l2_requestbuffers req = {0};
    req.count   = 1;
    req.type    = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    // req.memory = V4L2_MEMORY_MMAP;
    req.memory = V4L2_MEMORY_USERPTR;

    if (0 > ioctl (m_fd, VIDIOC_REQBUFS, &req)) {
        perror ("Intel_V4L2::init_device : VIDIOC_REQBUFS : ");
        return 1;
    }

    // Set Frame-rate. Need to be very slow.
    struct v4l2_streamparm streamParm = {0};
    // struct v4l2_captureparm
    // capability=V4L2_CAP_TIMEPERFRAME, capturemode=0, timeperframe=1/6, extendedmode=0, readbuffers=0
    streamParm.type                      = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    streamParm.parm.capture.capability   = V4L2_CAP_TIMEPERFRAME;
    streamParm.parm.capture.capturemode  = 0;
    streamParm.parm.capture.timeperframe.numerator   = 1;
    streamParm.parm.capture.timeperframe.denominator = 6;
    streamParm.parm.capture.extendedmode = 0;
    streamParm.parm.capture.readbuffers  = 0;
    if (0 > ioctl (m_fd, VIDIOC_S_PARM, &streamParm)) {
        perror ("Intel_V4L2::init_device : VIDIOC_S_PARM : ");
        return 1;
    }

    v4l2_buffer buf = {0};
    buf.type    = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    buf.memory  = V4L2_MEMORY_USERPTR;
    buf.index   = 0;
    if (0 > ioctl (m_fd, VIDIOC_QUERYBUF, &buf)) {
        perror ("Intel_V4L2::init_device : VIDIOC_QUERYBUF : ");
        return 1;
    }

    // Allocate a big buffer once.
    m_bigBufferLength = 1280 * 720 * 4 * 2 + 1024;
    m_pBigBuffer = (unsigned char *) malloc (m_bigBufferLength);
    assert (NULL != m_pBigBuffer);
    memset (m_pBigBuffer, 0, m_bigBufferLength);

    m_pV4l2Buffer = (v4l2_buffer *) calloc (1, sizeof (v4l2_buffer));
    m_pV4l2Buffer->type       = V4L2_BUF_TYPE_VIDEO_CAPTURE;
    m_pV4l2Buffer->memory     = V4L2_MEMORY_USERPTR;
    m_pV4l2Buffer->index      = 0;
    m_pV4l2Buffer->m.userptr  = (unsigned long) m_pBigBuffer;
    m_pV4l2Buffer->length     = m_bigBufferLength;

    // USB-UVC streaming:
    m_bufType = m_pV4l2Buffer->type;
    if (0 > ioctl (m_fd, VIDIOC_STREAMON, &m_bufType)) {
        perror ("Intel_V4L2::init_device : VIDIOC_STREAMON");
        return 1;
    }

    return 0;
}